

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt_n.hpp
# Opt level: O3

p_range_n * __thiscall
dna_bwt_n<dna_string_n>::LF
          (p_range_n *__return_storage_ptr__,dna_bwt_n<dna_string_n> *this,range_t rn)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  p_rank_n start;
  p_rank_n local_88;
  p_rank_n local_58;
  
  dna_string_n::parallel_rank(&local_88,&this->BWT,rn.first);
  uVar4 = local_88.T;
  uVar5 = local_88.G;
  uVar6 = local_88.N;
  uVar7 = local_88.A;
  uVar8 = local_88.C;
  if (rn.first < rn.second) {
    dna_string_n::parallel_rank(&local_58,&this->BWT,rn.second);
    uVar4 = local_58.T;
    uVar5 = local_58.G;
    uVar6 = local_58.N;
    uVar7 = local_58.A;
    uVar8 = local_58.C;
  }
  uVar1 = this->F_T;
  uVar2 = this->F_A;
  uVar3 = this->F_C;
  (__return_storage_ptr__->C).first = local_88.C + uVar3;
  (__return_storage_ptr__->C).second = uVar8 + uVar3;
  (__return_storage_ptr__->A).first = local_88.A + uVar2;
  (__return_storage_ptr__->A).second = uVar7 + uVar2;
  uVar7 = this->F_G;
  uVar8 = this->F_N;
  (__return_storage_ptr__->N).first = local_88.N + uVar8;
  (__return_storage_ptr__->N).second = uVar6 + uVar8;
  (__return_storage_ptr__->G).first = local_88.G + uVar7;
  (__return_storage_ptr__->G).second = uVar5 + uVar7;
  (__return_storage_ptr__->T).first = local_88.T + uVar1;
  (__return_storage_ptr__->T).second = uVar4 + uVar1;
  return __return_storage_ptr__;
}

Assistant:

p_range_n LF(range_t rn){

		assert(rn.second >= rn.first);

		//number of A,C,T,G before start of interval
		p_rank_n start = BWT.parallel_rank(rn.first);

		//number of A,C,T,G,N before end of interval (last position of interval included)
		p_rank_n end;

		if(rn.second>rn.first)
			end	= BWT.parallel_rank(rn.second);
		else
			end = start;

		assert(start <= end);

		p_rank_n f = {F_A,F_C,F_G,F_N,F_T};
		p_rank_n l = f + start;
		p_rank_n r = f + end;

		assert(r.A <= l.C);
		assert(r.C <= l.G);
		assert(r.G <= l.N);
		assert(r.N <= l.T);
		assert(l.T <= n);

		return fold_ranks(l,r);

	}